

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O2

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  undefined4 unaff_R12D;
  undefined4 uVar14;
  bool bVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  Mat local_a8;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Option *local_50;
  uint local_48;
  uint local_44;
  Mat *local_40;
  void *local_38;
  
  uVar1 = bottom_blob->dims;
  local_60 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  local_58 = bottom_blob->d;
  local_5c = bottom_blob->c;
  local_38 = (this->axes).data;
  if ((local_38 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    auVar22._0_4_ = -(uint)(this->squeeze_w == 0);
    auVar22._4_4_ = -(uint)(this->squeeze_h == 0);
    auVar22._8_4_ = -(uint)(this->squeeze_d == 0);
    auVar22._12_4_ = -(uint)(this->squeeze_c == 0);
    uVar14 = movmskps(unaff_R12D,auVar22);
    bVar16 = (byte)uVar14 ^ 0xf;
    uVar18 = (uint)((bVar16 & 8) >> 3 & local_5c == 1);
    bVar15 = (bool)((bVar16 & 4) >> 2 & local_58 == 1);
    bVar19 = (bool)(local_60 == 1 & bVar16);
    bVar13 = (bool)((bVar16 & 2) >> 1 & iVar9 == 1);
  }
  else {
    uVar18 = (this->axes).w;
    bVar20 = local_60 == 1;
    bVar21 = iVar9 == 1;
    local_44 = (uint)(local_5c == 1);
    local_48 = uVar1 - 3;
    uVar10 = 0;
    uVar6 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar6 = uVar10;
    }
    bVar19 = false;
    bVar13 = false;
    bVar15 = false;
    uVar18 = 0;
    for (; local_54 = iVar9, local_50 = opt, local_40 = bottom_blob, uVar6 != uVar10;
        uVar10 = uVar10 + 1) {
      iVar11 = *(int *)((long)local_38 + uVar10 * 4);
      iVar11 = (iVar11 >> 0x1f & uVar1) + iVar11;
      bVar8 = bVar19;
      uVar17 = uVar18;
      bVar12 = bVar13;
      if (iVar11 == 0) {
        bVar8 = bVar20;
        uVar17 = local_44;
        bVar12 = bVar21;
      }
      if (uVar1 != 2) {
        bVar12 = bVar13;
      }
      if (uVar1 != 1) {
        bVar8 = bVar19;
      }
      bVar19 = bVar8;
      bVar3 = bVar15;
      bVar7 = bVar12;
      if (iVar11 == 1) {
        bVar19 = bVar20;
        bVar3 = local_58 == 1;
        bVar7 = bVar21;
      }
      if (uVar1 != 2) {
        bVar19 = bVar8;
      }
      if (uVar1 != 3) {
        bVar7 = bVar12;
      }
      bVar12 = bVar19;
      bVar13 = bVar7;
      if (iVar11 == 2) {
        bVar12 = bVar20;
        bVar13 = bVar21;
      }
      if (uVar1 != 3) {
        bVar12 = bVar19;
      }
      if (1 < local_48) {
        uVar17 = uVar18;
      }
      bVar19 = bVar12;
      if (iVar11 == 3) {
        bVar19 = bVar20;
      }
      if (uVar1 != 4) {
        bVar13 = bVar7;
        bVar19 = bVar12;
        bVar3 = bVar15;
      }
      bVar15 = bVar3;
      uVar18 = uVar17;
    }
  }
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          local_54 = iVar9;
          local_50 = opt;
          free(top_blob->data);
          opt = local_50;
          iVar9 = local_54;
        }
        else {
          local_54 = iVar9;
          local_50 = opt;
          (*top_blob->allocator->_vptr_Allocator[3])();
          opt = local_50;
          iVar9 = local_54;
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar11 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    iVar5 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar11;
    top_blob->h = iVar4;
    top_blob->d = iVar5;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  switch(uVar1) {
  case 1:
    if (bVar19 == false) goto switchD_003c657f_default;
    Mat::reshape(&local_a8,bottom_blob,1,opt->blob_allocator);
    if (&local_a8 != top_blob) {
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->data = local_a8.data;
      top_blob->refcount = local_a8.refcount;
      top_blob->elemsize = local_a8.elemsize;
      top_blob->elempack = local_a8.elempack;
      top_blob->allocator = local_a8.allocator;
      top_blob->dims = local_a8.dims;
      top_blob->w = local_a8.w;
      top_blob->h = local_a8.h;
      top_blob->d = local_a8.d;
      top_blob->c = local_a8.c;
      top_blob->cstep = local_a8.cstep;
    }
    if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
    LOCK();
    *local_a8.refcount = *local_a8.refcount + -1;
    UNLOCK();
    if (*local_a8.refcount != 0) goto switchD_003c657f_default;
    if (local_a8.allocator != (Allocator *)0x0) {
      (*(local_a8.allocator)->_vptr_Allocator[3])();
      goto switchD_003c657f_default;
    }
    break;
  case 2:
    if (bVar19 == false) {
      if (bVar13 == false) goto switchD_003c657f_default;
      Mat::reshape(&local_a8,bottom_blob,local_60,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto switchD_003c657f_default;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto switchD_003c657f_default;
      }
    }
    else if (bVar13 == false) {
      Mat::reshape(&local_a8,bottom_blob,iVar9,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto switchD_003c657f_default;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto switchD_003c657f_default;
      }
    }
    else {
      Mat::reshape(&local_a8,bottom_blob,1,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto switchD_003c657f_default;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto switchD_003c657f_default;
      }
    }
    break;
  case 3:
    if (bVar19 == false) {
      if (bVar13 == false) {
        if (uVar18 == 0) goto switchD_003c657f_default;
        Mat::reshape(&local_a8,bottom_blob,local_60,iVar9,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
      else if (uVar18 == 0) {
        Mat::reshape(&local_a8,bottom_blob,local_60,local_5c,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
      else {
        Mat::reshape(&local_a8,bottom_blob,local_60,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
    }
    else if (bVar13 == false) {
      if (uVar18 == 0) {
        Mat::reshape(&local_a8,bottom_blob,iVar9,local_5c,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
      else {
        Mat::reshape(&local_a8,bottom_blob,iVar9,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
    }
    else if (uVar18 == 0) {
      Mat::reshape(&local_a8,bottom_blob,local_5c,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto switchD_003c657f_default;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto switchD_003c657f_default;
      }
    }
    else {
      Mat::reshape(&local_a8,bottom_blob,1,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto switchD_003c657f_default;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto switchD_003c657f_default;
      }
    }
    break;
  case 4:
    if (bVar19 == false) {
      if (bVar13 == false) {
        if (bVar15 == false) {
          if (uVar18 == 0) goto switchD_003c657f_default;
          Mat::reshape(&local_a8,bottom_blob,local_60,iVar9,local_58,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto switchD_003c657f_default;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto switchD_003c657f_default;
          }
        }
        else if (uVar18 == 0) {
          Mat::reshape(&local_a8,bottom_blob,local_60,iVar9,local_5c,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto switchD_003c657f_default;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto switchD_003c657f_default;
          }
        }
        else {
          Mat::reshape(&local_a8,bottom_blob,local_60,iVar9,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto switchD_003c657f_default;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto switchD_003c657f_default;
          }
        }
      }
      else if (bVar15 == false) {
        if (uVar18 == 0) {
          Mat::reshape(&local_a8,bottom_blob,local_60,local_58,local_5c,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto switchD_003c657f_default;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto switchD_003c657f_default;
          }
        }
        else {
          Mat::reshape(&local_a8,bottom_blob,local_60,local_58,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto switchD_003c657f_default;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto switchD_003c657f_default;
          }
        }
      }
      else if (uVar18 == 0) {
        Mat::reshape(&local_a8,bottom_blob,local_60,local_5c,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
      else {
        Mat::reshape(&local_a8,bottom_blob,local_60,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
    }
    else if (bVar13 == false) {
      if (bVar15 == false) {
        if (uVar18 == 0) {
          Mat::reshape(&local_a8,bottom_blob,iVar9,local_58,local_5c,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto switchD_003c657f_default;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto switchD_003c657f_default;
          }
        }
        else {
          Mat::reshape(&local_a8,bottom_blob,iVar9,local_58,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto switchD_003c657f_default;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto switchD_003c657f_default;
          }
        }
      }
      else if (uVar18 == 0) {
        Mat::reshape(&local_a8,bottom_blob,iVar9,local_5c,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
      else {
        Mat::reshape(&local_a8,bottom_blob,iVar9,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
    }
    else if (bVar15 == false) {
      if (uVar18 == 0) {
        Mat::reshape(&local_a8,bottom_blob,local_58,local_5c,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
      else {
        Mat::reshape(&local_a8,bottom_blob,local_58,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto switchD_003c657f_default;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto switchD_003c657f_default;
        }
      }
    }
    else if (uVar18 == 0) {
      Mat::reshape(&local_a8,bottom_blob,local_5c,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto switchD_003c657f_default;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto switchD_003c657f_default;
      }
    }
    else {
      Mat::reshape(&local_a8,bottom_blob,1,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto switchD_003c657f_default;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto switchD_003c657f_default;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto switchD_003c657f_default;
      }
    }
    break;
  default:
    goto switchD_003c657f_default;
  }
  free(local_a8.data);
switchD_003c657f_default:
  if ((top_blob->data == (void *)0x0) || (iVar9 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar9 = -100;
  }
  return iVar9;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_d = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_d = d == 1 && squeeze_d;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 4 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 4 && axis == 1)
            {
                _squeeze_d = d == 1;
            }
            if (dims == 4 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 4 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (dims == 4)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(d, channels, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, d, opt.blob_allocator);
        }
        else if (_squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, h, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, d, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}